

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSimSat.c
# Opt level: O1

void Ssw_ManResimulateWord(Ssw_Man_t *p,Aig_Obj_t *pCand,Aig_Obj_t *pRepr,int f)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  Ssw_SmlAssignDist1Plus(p->pSml,p->pPatWords);
  Ssw_SmlSimulateOne(p->pSml);
  iVar1 = Ssw_ClassesRefineConst1(p->ppClasses,1);
  iVar2 = Ssw_ClassesRefine(p->ppClasses,1);
  if (((ulong)pRepr & 1) == 0) {
    if ((*(uint *)&pRepr->field_0x18 & 7) == 1) {
      if (iVar1 == 0) {
        __assert_fail("RetValue1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSimSat.c"
                      ,0x6a,"void Ssw_ManResimulateWord(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)"
                     );
      }
    }
    else if (iVar2 == 0) {
      __assert_fail("RetValue2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSimSat.c"
                    ,0x70,"void Ssw_ManResimulateWord(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
    }
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    p->timeSimSat = p->timeSimSat + lVar4 + lVar3;
    return;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
}

Assistant:

void Ssw_ManResimulateWord( Ssw_Man_t * p, Aig_Obj_t * pCand, Aig_Obj_t * pRepr, int f )
{
    int RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // set the PI simulation information
    Ssw_SmlAssignDist1Plus( p->pSml, p->pPatWords );
    // simulate internal nodes
    Ssw_SmlSimulateOne( p->pSml );
    // check equivalence classes
    RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 1 );
    RetValue2 = Ssw_ClassesRefine( p->ppClasses, 1 );
    // make sure refinement happened
    if ( Aig_ObjIsConst1(pRepr) )
    {
        assert( RetValue1 );
        if ( RetValue1 == 0 )
            Abc_Print( 1, "\nSsw_ManResimulateWord() Error: RetValue1 does not hold.\n" );
    }
    else
    {
        assert( RetValue2 );
        if ( RetValue2 == 0 )
            Abc_Print( 1, "\nSsw_ManResimulateWord() Error: RetValue2 does not hold.\n" );
    }
p->timeSimSat += Abc_Clock() - clk;
}